

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
emplace<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>
          (QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *this,qsizetype i,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *args)

{
  QHttpNetworkRequest *this_00;
  int *piVar1;
  long lVar2;
  long in_FS_OFFSET;
  Inserter local_98;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = *(int **)this;
  if ((piVar1 == (int *)0x0) || (1 < *piVar1)) {
LAB_0020628c:
    local_48.second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_48.first.d.d.ptr =
         (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
    QHttpNetworkRequest::QHttpNetworkRequest(&local_48.first,&args->first);
    local_48.second = args->second;
    lVar2 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this,
               (uint)(i == 0 && lVar2 != 0),1,(pair<QHttpNetworkRequest,_QHttpNetworkReply_*> **)0x0
               ,(QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x0);
    if (i == 0 && lVar2 != 0) {
      lVar2 = *(long *)(this + 8);
      QHttpNetworkRequest::QHttpNetworkRequest
                ((QHttpNetworkRequest *)(lVar2 + -0x18),&local_48.first);
      *(QHttpNetworkReply **)(lVar2 + -8) = local_48.second;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    else {
      local_98.sourceCopyConstruct = 0;
      local_98.nSource = 0;
      local_98.move = 0;
      local_98.sourceCopyAssign = 0;
      local_98.end = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
      local_98.last = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
      local_98.where = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
      local_98.begin = *(pair<QHttpNetworkRequest,_QHttpNetworkReply_*> **)(this + 8);
      local_98.size = *(qsizetype *)(this + 0x10);
      local_98.data =
           (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)this;
      QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::Inserter::insertOne
                (&local_98,i,&local_48);
      (local_98.data)->ptr = local_98.begin;
      (local_98.data)->size = local_98.size;
    }
    QHttpNetworkRequest::~QHttpNetworkRequest(&local_48.first);
  }
  else {
    lVar2 = *(long *)(this + 0x10);
    if ((lVar2 == i && piVar1 != (int *)0x0) &&
       (*(long *)(piVar1 + 2) - lVar2 !=
        ((long)(*(long *)(this + 8) - ((long)piVar1 + 0x1fU & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      this_00 = (QHttpNetworkRequest *)(*(long *)(this + 8) + lVar2 * 0x18);
      QHttpNetworkRequest::QHttpNetworkRequest(this_00,&args->first);
      this_00[1].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)args->second;
    }
    else {
      if (((i != 0) || (piVar1 == (int *)0x0)) ||
         (((long)piVar1 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_0020628c;
      lVar2 = *(long *)(this + 8);
      QHttpNetworkRequest::QHttpNetworkRequest((QHttpNetworkRequest *)(lVar2 + -0x18),&args->first);
      *(QHttpNetworkReply **)(lVar2 + -8) = args->second;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }